

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O2

void __thiscall QXcbScreen::~QXcbScreen(QXcbScreen *this)

{
  *(undefined ***)this = &PTR__QXcbScreen_001b0df8;
  *(undefined ***)(this + 0x18) = &PTR__QXcbScreen_001b0ef8;
  QEdidParser::~QEdidParser((QEdidParser *)(this + 0xe8));
  std::unique_ptr<QXcbCursor,_std::default_delete<QXcbCursor>_>::~unique_ptr
            ((unique_ptr<QXcbCursor,_std::default_delete<QXcbCursor>_> *)(this + 0xd8));
  QColorSpace::~QColorSpace((QColorSpace *)(this + 200));
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(this + 0x70));
  QArrayDataPointer<unsigned_int>::~QArrayDataPointer
            ((QArrayDataPointer<unsigned_int> *)(this + 0x58));
  QArrayDataPointer<unsigned_int>::~QArrayDataPointer
            ((QArrayDataPointer<unsigned_int> *)(this + 0x40));
  QNativeInterface::Private::QXcbScreen::~QXcbScreen(this + 0x18);
  QPlatformScreen::~QPlatformScreen((QPlatformScreen *)this);
  return;
}

Assistant:

QXcbScreen::~QXcbScreen()
{
}